

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

OPENJTALK_ARCH openjtalk_getArch(OpenJTalk *oj)

{
  return OPENJTALK_ARCH_UNKNOWN;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getArch(OpenJTalk *oj)
{
#if defined(_WIN32)
#if defined(_WIN64)
	return OPENJTALK_ARCH_X64;
#else
	return OPENJTALK_ARCH_X86;
#endif
#elif defined(__arm__) || defined(_M_ARM) || defined(__aarch64__)
	return OPENJTALK_ARCH_ARM;
#else
	return OPENJTALK_ARCH_UNKNOWN;
#endif
}